

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::SharedBasicVarCase::iterate(SharedBasicVarCase *this)

{
  glUniform1fvFunc p_Var1;
  glUniform2fvFunc p_Var2;
  glUniform3fvFunc p_Var3;
  glUniform4fvFunc p_Var4;
  glUniform1uivFunc p_Var5;
  glUniform2uivFunc p_Var6;
  glUniform3uivFunc p_Var7;
  glUniform4uivFunc p_Var8;
  glUniform1ivFunc p_Var9;
  glUniform2ivFunc p_Var10;
  glUniform3ivFunc p_Var11;
  glUniform4ivFunc p_Var12;
  glUniformMatrix2fvFunc p_Var13;
  glUniformMatrix2x3fvFunc p_Var14;
  glUniformMatrix2x4fvFunc p_Var15;
  glUniformMatrix3x2fvFunc p_Var16;
  glUniformMatrix3fvFunc p_Var17;
  glUniformMatrix3x4fvFunc p_Var18;
  glUniformMatrix4x2fvFunc p_Var19;
  glUniformMatrix4x3fvFunc p_Var20;
  glUniformMatrix4fvFunc p_Var21;
  glUniform1uiFunc p_Var22;
  glBindBufferFunc p_Var23;
  glBufferDataFunc p_Var24;
  glBindBufferBaseFunc p_Var25;
  undefined4 program_00;
  bool bVar26;
  int iVar27;
  GLuint index;
  uint uVar28;
  GLint GVar29;
  GLint GVar30;
  GLint GVar31;
  int iVar32;
  int iVar33;
  GLenum GVar34;
  deUint32 dVar35;
  deBool dVar36;
  RenderContext *pRVar37;
  undefined4 extraout_var;
  reference pvVar38;
  uint *puVar39;
  reference pvVar40;
  size_type sVar41;
  reference pvVar42;
  ulong uVar43;
  iterator __first;
  iterator __last;
  reference pvVar44;
  deUint32 *pdVar45;
  TestError *this_00;
  TestLog *pTVar46;
  MessageBuilder *pMVar47;
  uint uVar48;
  char *description;
  GLint local_8b8;
  GLint local_850;
  GLint local_7e4;
  GLint local_780;
  GLint local_718;
  uint local_6cc;
  MessageBuilder local_6c8;
  MessageBuilder local_548;
  MessageBuilder local_3c8;
  int local_248;
  uint local_244;
  int resVal;
  deUint32 ndx_5;
  int numFailed;
  int maxErrMsg;
  void *resPtr;
  InterfaceVariableInfo outVarInfo;
  deUint32 numValues_1;
  allocator<unsigned_char> local_1c1;
  undefined1 local_1c0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> emptyData;
  int location_4;
  int uNdx_4;
  int ndx_4;
  vector<float,_std::allocator<float>_> values_4;
  int minInt_2;
  int maxInt_3;
  int location_3;
  int uNdx_3;
  int ndx_3;
  vector<int,_std::allocator<int>_> values_3;
  Random rnd;
  int location_2;
  int uNdx_2;
  int ndx_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values_2;
  deUint32 maxInt_2;
  int location_1;
  int uNdx_1;
  int ndx_1;
  vector<int,_std::allocator<int>_> values_1;
  int minInt_1;
  int maxInt_1;
  int location;
  int uNdx;
  int ndx;
  vector<float,_std::allocator<float>_> values;
  int minInt;
  int maxInt;
  int scalarSize;
  int iterCountLoc;
  int refLoc;
  int valLoc;
  int numValues;
  InterfaceBlockInfo outBlockInfo;
  undefined1 local_38 [4];
  deUint32 outBlockNdx;
  Buffer outputBuffer;
  deUint32 program;
  Functions *gl;
  SharedBasicVarCase *this_local;
  Functions *gl_00;
  
  pRVar37 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar27 = (*pRVar37->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar27);
  outputBuffer.super_ObjectWrapper._20_4_ = glu::ShaderProgram::getProgram(this->m_program);
  pRVar37 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_38,pRVar37);
  index = (*gl_00->getProgramResourceIndex)(outputBuffer.super_ObjectWrapper._20_4_,0x92e6,"Result")
  ;
  glu::getProgramInterfaceBlockInfo
            ((InterfaceBlockInfo *)&valLoc,gl_00,outputBuffer.super_ObjectWrapper._20_4_,0x92e6,
             index);
  (*gl_00->useProgram)(outputBuffer.super_ObjectWrapper._20_4_);
  uVar28 = product<unsigned_int,3>(&this->m_workGroupSize);
  GVar29 = (*gl_00->getUniformLocation)(outputBuffer.super_ObjectWrapper._20_4_,"u_val[0]");
  GVar30 = (*gl_00->getUniformLocation)(outputBuffer.super_ObjectWrapper._20_4_,"u_ref[0]");
  GVar31 = (*gl_00->getUniformLocation)(outputBuffer.super_ObjectWrapper._20_4_,"u_numIters");
  iVar27 = glu::getDataTypeScalarSize(this->m_basicType);
  bVar26 = glu::isDataTypeFloatOrVec(this->m_basicType);
  if (bVar26) {
    iVar33 = 0x400;
    if (this->m_precision == PRECISION_LOWP) {
      iVar33 = 2;
    }
    iVar32 = de::min<int>((int)uVar28 / 2,iVar33);
    values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = -iVar32;
    std::allocator<float>::allocator((allocator<float> *)((long)&uNdx + 3));
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&ndx,(long)(int)(uVar28 * iVar27),
               (allocator<float> *)((long)&uNdx + 3));
    std::allocator<float>::~allocator((allocator<float> *)((long)&uNdx + 3));
    for (location = 0;
        sVar41 = std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)&ndx), location < (int)sVar41;
        location = location + 1) {
      iVar32 = values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ +
               location %
               ((iVar33 - values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_) + 1);
      pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&ndx,(long)location);
      *pvVar42 = (float)iVar32;
    }
    for (maxInt_1 = 0; maxInt_1 < 2; maxInt_1 = maxInt_1 + 1) {
      local_718 = GVar29;
      if (maxInt_1 == 1) {
        local_718 = GVar30;
      }
      if (iVar27 == 1) {
        p_Var1 = gl_00->uniform1fv;
        pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&ndx,0);
        (*p_Var1)(local_718,uVar28,pvVar42);
      }
      else if (iVar27 == 2) {
        p_Var2 = gl_00->uniform2fv;
        pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&ndx,0);
        (*p_Var2)(local_718,uVar28,pvVar42);
      }
      else if (iVar27 == 3) {
        p_Var3 = gl_00->uniform3fv;
        pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&ndx,0);
        (*p_Var3)(local_718,uVar28,pvVar42);
      }
      else if (iVar27 == 4) {
        p_Var4 = gl_00->uniform4fv;
        pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&ndx,0);
        (*p_Var4)(local_718,uVar28,pvVar42);
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&ndx);
  }
  else {
    bVar26 = glu::isDataTypeIntOrIVec(this->m_basicType);
    if (bVar26) {
      values_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0x400;
      if (this->m_precision == PRECISION_LOWP) {
        values_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0x40;
      }
      iVar33 = de::min<int>((int)uVar28 / 2,
                            values_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_);
      values_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = -iVar33;
      std::allocator<int>::allocator((allocator<int> *)((long)&uNdx_1 + 3));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&ndx_1,(long)(int)(uVar28 * iVar27),
                 (allocator<int> *)((long)&uNdx_1 + 3));
      std::allocator<int>::~allocator((allocator<int> *)((long)&uNdx_1 + 3));
      for (location_1 = 0;
          sVar41 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)&ndx_1), location_1 < (int)sVar41
          ; location_1 = location_1 + 1) {
        iVar33 = (int)values_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage +
                 location_1 %
                 ((values_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ -
                  (int)values_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) + 1);
        pvVar40 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&ndx_1,(long)location_1);
        *pvVar40 = iVar33;
      }
      for (maxInt_2 = 0; (int)maxInt_2 < 2; maxInt_2 = maxInt_2 + 1) {
        local_780 = GVar29;
        if (maxInt_2 == 1) {
          local_780 = GVar30;
        }
        if (iVar27 == 1) {
          p_Var9 = gl_00->uniform1iv;
          pvVar40 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&ndx_1,0);
          (*p_Var9)(local_780,uVar28,pvVar40);
        }
        else if (iVar27 == 2) {
          p_Var10 = gl_00->uniform2iv;
          pvVar40 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&ndx_1,0);
          (*p_Var10)(local_780,uVar28,pvVar40);
        }
        else if (iVar27 == 3) {
          p_Var11 = gl_00->uniform3iv;
          pvVar40 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&ndx_1,0);
          (*p_Var11)(local_780,uVar28,pvVar40);
        }
        else if (iVar27 == 4) {
          p_Var12 = gl_00->uniform4iv;
          pvVar40 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&ndx_1,0);
          (*p_Var12)(local_780,uVar28,pvVar40);
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&ndx_1);
    }
    else {
      bVar26 = glu::isDataTypeUintOrUVec(this->m_basicType);
      if (bVar26) {
        values_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0x400;
        if (this->m_precision == PRECISION_LOWP) {
          values_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0x80;
        }
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&uNdx_2 + 3));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_2,
                   (long)(int)(uVar28 * iVar27),(allocator<unsigned_int> *)((long)&uNdx_2 + 3));
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&uNdx_2 + 3));
        for (location_2 = 0;
            sVar41 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_2),
            location_2 < (int)sVar41; location_2 = location_2 + 1) {
          uVar48 = values_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          pvVar38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_2,
                               (long)location_2);
          *pvVar38 = (uint)location_2 % uVar48;
        }
        for (rnd.m_rnd.w = 0; (int)rnd.m_rnd.w < 2; rnd.m_rnd.w = rnd.m_rnd.w + 1) {
          local_7e4 = GVar29;
          if (rnd.m_rnd.w == 1) {
            local_7e4 = GVar30;
          }
          if (iVar27 == 1) {
            p_Var5 = gl_00->uniform1uiv;
            pvVar38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_2,0);
            (*p_Var5)(local_7e4,uVar28,pvVar38);
          }
          else if (iVar27 == 2) {
            p_Var6 = gl_00->uniform2uiv;
            pvVar38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_2,0);
            (*p_Var6)(local_7e4,uVar28,pvVar38);
          }
          else if (iVar27 == 3) {
            p_Var7 = gl_00->uniform3uiv;
            pvVar38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_2,0);
            (*p_Var7)(local_7e4,uVar28,pvVar38);
          }
          else if (iVar27 == 4) {
            p_Var8 = gl_00->uniform4uiv;
            pvVar38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_2,0);
            (*p_Var8)(local_7e4,uVar28,pvVar38);
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx_2);
      }
      else {
        bVar26 = glu::isDataTypeBoolOrBVec(this->m_basicType);
        if (bVar26) {
          de::Random::Random((Random *)
                             &values_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,0x324f);
          std::allocator<int>::allocator((allocator<int> *)((long)&uNdx_3 + 3));
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&ndx_3,(long)(int)(uVar28 * iVar27),
                     (allocator<int> *)((long)&uNdx_3 + 3));
          std::allocator<int>::~allocator((allocator<int> *)((long)&uNdx_3 + 3));
          for (location_3 = 0;
              sVar41 = std::vector<int,_std::allocator<int>_>::size
                                 ((vector<int,_std::allocator<int>_> *)&ndx_3),
              location_3 < (int)sVar41; location_3 = location_3 + 1) {
            bVar26 = de::Random::getBool((Random *)
                                         &values_3.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
            puVar39 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)&ndx_3,
                                         (long)location_3);
            *puVar39 = (uint)bVar26;
          }
          for (maxInt_3 = 0; maxInt_3 < 2; maxInt_3 = maxInt_3 + 1) {
            local_850 = GVar29;
            if (maxInt_3 == 1) {
              local_850 = GVar30;
            }
            if (iVar27 == 1) {
              p_Var9 = gl_00->uniform1iv;
              pvVar40 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&ndx_3,0);
              (*p_Var9)(local_850,uVar28,pvVar40);
            }
            else if (iVar27 == 2) {
              p_Var10 = gl_00->uniform2iv;
              pvVar40 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&ndx_3,0);
              (*p_Var10)(local_850,uVar28,pvVar40);
            }
            else if (iVar27 == 3) {
              p_Var11 = gl_00->uniform3iv;
              pvVar40 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&ndx_3,0);
              (*p_Var11)(local_850,uVar28,pvVar40);
            }
            else if (iVar27 == 4) {
              p_Var12 = gl_00->uniform4iv;
              pvVar40 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&ndx_3,0);
              (*p_Var12)(local_850,uVar28,pvVar40);
            }
          }
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)&ndx_3);
          de::Random::~Random((Random *)
                              &values_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
        }
        else {
          bVar26 = glu::isDataTypeMatrix(this->m_basicType);
          if (bVar26) {
            values_4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0x400;
            if (this->m_precision == PRECISION_LOWP) {
              values_4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
            }
            iVar33 = de::min<int>((int)uVar28 / 2,
                                  values_4.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage._4_4_);
            values_4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = -iVar33;
            std::allocator<float>::allocator((allocator<float> *)((long)&uNdx_4 + 3));
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&ndx_4,(long)(int)(uVar28 * iVar27),
                       (allocator<float> *)((long)&uNdx_4 + 3));
            std::allocator<float>::~allocator((allocator<float> *)((long)&uNdx_4 + 3));
            for (location_4 = 0;
                sVar41 = std::vector<float,_std::allocator<float>_>::size
                                   ((vector<float,_std::allocator<float>_> *)&ndx_4),
                location_4 < (int)sVar41; location_4 = location_4 + 1) {
              iVar27 = (int)values_4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage +
                       location_4 %
                       ((values_4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ -
                        (int)values_4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage) + 1);
              pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&ndx_4,(long)location_4)
              ;
              *pvVar42 = (float)iVar27;
            }
            for (emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ < 2;
                emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ =
                     emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
              local_8b8 = GVar29;
              if (emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
                local_8b8 = GVar30;
              }
              emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = local_8b8;
              switch(this->m_basicType) {
              case TYPE_FLOAT_MAT2:
                p_Var13 = gl_00->uniformMatrix2fv;
                pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)&ndx_4,0);
                (*p_Var13)(local_8b8,uVar28,'\0',pvVar42);
                break;
              case TYPE_FLOAT_MAT2X3:
                p_Var14 = gl_00->uniformMatrix2x3fv;
                pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)&ndx_4,0);
                (*p_Var14)(local_8b8,uVar28,'\0',pvVar42);
                break;
              case TYPE_FLOAT_MAT2X4:
                p_Var15 = gl_00->uniformMatrix2x4fv;
                pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)&ndx_4,0);
                (*p_Var15)(local_8b8,uVar28,'\0',pvVar42);
                break;
              case TYPE_FLOAT_MAT3X2:
                p_Var16 = gl_00->uniformMatrix3x2fv;
                pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)&ndx_4,0);
                (*p_Var16)(local_8b8,uVar28,'\0',pvVar42);
                break;
              case TYPE_FLOAT_MAT3:
                p_Var17 = gl_00->uniformMatrix3fv;
                pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)&ndx_4,0);
                (*p_Var17)(local_8b8,uVar28,'\0',pvVar42);
                break;
              case TYPE_FLOAT_MAT3X4:
                p_Var18 = gl_00->uniformMatrix3x4fv;
                pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)&ndx_4,0);
                (*p_Var18)(local_8b8,uVar28,'\0',pvVar42);
                break;
              case TYPE_FLOAT_MAT4X2:
                p_Var19 = gl_00->uniformMatrix4x2fv;
                pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)&ndx_4,0);
                (*p_Var19)(local_8b8,uVar28,'\0',pvVar42);
                break;
              case TYPE_FLOAT_MAT4X3:
                p_Var20 = gl_00->uniformMatrix4x3fv;
                pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)&ndx_4,0);
                (*p_Var20)(local_8b8,uVar28,'\0',pvVar42);
                break;
              case TYPE_FLOAT_MAT4:
                p_Var21 = gl_00->uniformMatrix4fv;
                pvVar42 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)&ndx_4,0);
                (*p_Var21)(local_8b8,uVar28,'\0',pvVar42);
              }
            }
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)&ndx_4);
          }
        }
      }
    }
  }
  p_Var22 = gl_00->uniform1ui;
  uVar28 = product<unsigned_int,3>(&this->m_workGroupSize);
  (*p_Var22)(GVar31,uVar28);
  GVar34 = (*gl_00->getError)();
  glu::checkError(GVar34,"Input value setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x12a);
  uVar43 = (ulong)outBlockInfo.index;
  std::allocator<unsigned_char>::allocator(&local_1c1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0,uVar43,&local_1c1);
  std::allocator<unsigned_char>::~allocator(&local_1c1);
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
  outVarInfo._76_4_ = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current,(int *)&outVarInfo.field_0x4c);
  p_Var23 = gl_00->bindBuffer;
  dVar35 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_38);
  (*p_Var23)(0x90d2,dVar35);
  p_Var24 = gl_00->bufferData;
  uVar43 = (ulong)outBlockInfo.index;
  pvVar44 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0,0);
  (*p_Var24)(0x90d2,uVar43,pvVar44,0x88e5);
  p_Var25 = gl_00->bindBufferBase;
  dVar35 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_38);
  (*p_Var25)(0x90d2,0,dVar35);
  GVar34 = (*gl_00->getError)();
  glu::checkError(GVar34,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x135);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
  (*gl_00->dispatchCompute)(1,1,1);
  outVarInfo._72_4_ = product<unsigned_int,3>(&this->m_workGroupSize);
  program_00 = outputBuffer.super_ObjectWrapper._20_4_;
  pdVar45 = (deUint32 *)
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&outBlockInfo.dataSize,0);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&resPtr,gl_00,program_00,0x92e5,*pdVar45);
  _numFailed = (*gl_00->mapBufferRange)(0x90d2,0,(ulong)outBlockInfo.index,1);
  ndx_5 = 10;
  resVal = 0;
  GVar34 = (*gl_00->getError)();
  glu::checkError(GVar34,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                  ,0x142);
  while ((dVar36 = ::deGetFalse(), dVar36 == 0 && (_numFailed != (void *)0x0))) {
    dVar36 = ::deGetFalse();
    if (dVar36 == 0) {
      for (local_244 = 0; local_244 < (uint)outVarInfo._72_4_; local_244 = local_244 + 1) {
        local_248 = *(int *)((long)_numFailed +
                            (ulong)(outVarInfo.arraySize * local_244) + (ulong)outVarInfo.type);
        if (local_248 == 0) {
          if (resVal < 10) {
            pTVar46 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_3c8,pTVar46,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar47 = tcu::MessageBuilder::operator<<(&local_3c8,(char (*) [13])"ERROR: isOk[");
            pMVar47 = tcu::MessageBuilder::operator<<(pMVar47,&local_244);
            pMVar47 = tcu::MessageBuilder::operator<<(pMVar47,(char (*) [5])0x2bbcf58);
            pMVar47 = tcu::MessageBuilder::operator<<(pMVar47,&local_248);
            pMVar47 = tcu::MessageBuilder::operator<<(pMVar47,(char (*) [9])" != true");
            tcu::MessageBuilder::operator<<(pMVar47,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_3c8);
          }
          else if (resVal == 10) {
            pTVar46 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_548,pTVar46,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar47 = tcu::MessageBuilder::operator<<(&local_548,(char (*) [4])0x2b51841);
            tcu::MessageBuilder::operator<<(pMVar47,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_548);
          }
          resVal = resVal + 1;
        }
      }
      (*gl_00->unmapBuffer)(0x90d2);
      GVar34 = (*gl_00->getError)();
      glu::checkError(GVar34,"glUnmapBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
                      ,0x155);
      pTVar46 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_6c8,pTVar46,(BeginMessageToken *)&tcu::TestLog::Message);
      local_6cc = outVarInfo._72_4_ - resVal;
      pMVar47 = tcu::MessageBuilder::operator<<(&local_6c8,&local_6cc);
      pMVar47 = tcu::MessageBuilder::operator<<(pMVar47,(char (*) [4])0x2b88b0c);
      pMVar47 = tcu::MessageBuilder::operator<<(pMVar47,(uint *)&outVarInfo.isRowMajor);
      pMVar47 = tcu::MessageBuilder::operator<<(pMVar47,(char (*) [15])" values passed");
      tcu::MessageBuilder::operator<<(pMVar47,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6c8);
      description = "Comparison failed";
      if (resVal == 0) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(resVal != 0),
                 description);
      glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)&resPtr);
      glu::InterfaceBlockInfo::~InterfaceBlockInfo((InterfaceBlockInfo *)&valLoc);
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)local_38);
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"resPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderSharedVarTests.cpp"
             ,0x143);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

SharedBasicVarCase::IterateResult SharedBasicVarCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	Buffer						outputBuffer	(m_context.getRenderContext());
	const deUint32				outBlockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "Result");
	const InterfaceBlockInfo	outBlockInfo	= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, outBlockNdx);

	gl.useProgram(program);

	// Setup input values.
	{
		const int		numValues		= (int)product(m_workGroupSize);
		const int		valLoc			= gl.getUniformLocation(program, "u_val[0]");
		const int		refLoc			= gl.getUniformLocation(program, "u_ref[0]");
		const int		iterCountLoc	= gl.getUniformLocation(program, "u_numIters");
		const int		scalarSize		= getDataTypeScalarSize(m_basicType);

		if (isDataTypeFloatOrVec(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 2 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<float>	values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = float(minInt + (ndx % (maxInt-minInt+1)));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1fv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2fv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3fv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4fv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeIntOrIVec(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 64 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<int>		values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = minInt + (ndx % (maxInt-minInt+1));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1iv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2iv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3iv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4iv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeUintOrUVec(m_basicType))
		{
			const deUint32		maxInt		= m_precision == glu::PRECISION_LOWP ? 128 : 1024;
			vector<deUint32>	values		(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = ndx % (maxInt+1);

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1uiv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2uiv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3uiv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4uiv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeBoolOrBVec(m_basicType))
		{
			de::Random		rnd				(0x324f);
			vector<int>		values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = rnd.getBool() ? 1 : 0;

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				if (scalarSize == 1)		gl.uniform1iv(location, numValues, &values[0]);
				else if (scalarSize == 2)	gl.uniform2iv(location, numValues, &values[0]);
				else if (scalarSize == 3)	gl.uniform3iv(location, numValues, &values[0]);
				else if (scalarSize == 4)	gl.uniform4iv(location, numValues, &values[0]);
			}
		}
		else if (isDataTypeMatrix(m_basicType))
		{
			const int		maxInt			= m_precision == glu::PRECISION_LOWP ? 2 : 1024;
			const int		minInt			= -de::min(numValues/2, maxInt);
			vector<float>	values			(numValues*scalarSize);

			for (int ndx = 0; ndx < (int)values.size(); ndx++)
				values[ndx] = float(minInt + (ndx % (maxInt-minInt+1)));

			for (int uNdx = 0; uNdx < 2; uNdx++)
			{
				const int location = uNdx == 1 ? refLoc : valLoc;

				switch (m_basicType)
				{
					case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv  (location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT2X3:	gl.uniformMatrix2x3fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT2X4:	gl.uniformMatrix2x4fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3X2:	gl.uniformMatrix3x2fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv  (location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT3X4:	gl.uniformMatrix3x4fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4X2:	gl.uniformMatrix4x2fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4X3:	gl.uniformMatrix4x3fv(location, numValues, DE_FALSE, &values[0]);	break;
					case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv  (location, numValues, DE_FALSE, &values[0]);	break;
					default:
						DE_ASSERT(false);
				}
			}
		}

		gl.uniform1ui(iterCountLoc, product(m_workGroupSize));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Input value setup failed");
	}

	// Setup output buffer.
	{
		vector<deUint8> emptyData(outBlockInfo.dataSize);
		std::fill(emptyData.begin(), emptyData.end(), 0);

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, outBlockInfo.dataSize, &emptyData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(1, 1, 1);

	// Read back and compare
	{
		const deUint32				numValues	= product(m_workGroupSize);
		const InterfaceVariableInfo	outVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outBlockInfo.activeVariables[0]);
		const void*					resPtr		= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, outBlockInfo.dataSize, GL_MAP_READ_BIT);
		const int					maxErrMsg	= 10;
		int							numFailed	= 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
		{
			const int resVal = *((const int*)((const deUint8*)resPtr + outVarInfo.offset + outVarInfo.arrayStride*ndx));

			if (resVal == 0)
			{
				if (numFailed < maxErrMsg)
					m_testCtx.getLog() << TestLog::Message << "ERROR: isOk[" << ndx << "] = " << resVal << " != true" << TestLog::EndMessage;
				else if (numFailed == maxErrMsg)
					m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

				numFailed += 1;
			}
		}

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.getLog() << TestLog::Message << (numValues-numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

		m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								numFailed == 0 ? "Pass"					: "Comparison failed");
	}

	return STOP;
}